

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequenceDistanceGraph.cc
# Opt level: O2

void __thiscall
SequenceDistanceGraph::load_from_gfa2(SequenceDistanceGraph *this,ifstream *gfaf,ifstream *fastaf)

{
  string *psVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *this_00;
  long lVar2;
  SequenceDistanceGraph *pSVar3;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var4;
  bool bVar5;
  ostream *poVar6;
  iterator iVar7;
  sgNodeID_t sVar8;
  mapped_type *pmVar9;
  istream *piVar10;
  logic_error *this_01;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  allocator local_511;
  SequenceDistanceGraph *local_510;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_508;
  int32_t dist;
  ulong local_4f8;
  string gfa_source;
  string gfa_dest;
  uint source_end;
  uint source_beg;
  string local_4a0;
  string gfa_rtype;
  string line;
  string name;
  uint dest_end;
  uint dest_beg;
  string gfa_destdir;
  string gfa_sourcedir;
  string id;
  string seq;
  string gfa_length;
  string gfa_star;
  string gfa_cigar;
  Node local_338;
  Node local_300;
  Node local_2c8;
  Node local_290;
  Node local_258;
  Node local_220;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  gap_dist;
  istringstream iss;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  local_510 = this;
  poVar6 = sdglib::OutputLog(INFO,true);
  poVar6 = std::operator<<(poVar6,"Graph fasta filename: ");
  psVar1 = &local_510->fasta_filename;
  poVar6 = std::operator<<(poVar6,(string *)psVar1);
  std::endl<char,std::char_traits<char>>(poVar6);
  poVar6 = sdglib::OutputLog(INFO,true);
  poVar6 = std::operator<<(poVar6,"Loading sequences from ");
  poVar6 = std::operator<<(poVar6,(string *)psVar1);
  std::endl<char,std::char_traits<char>>(poVar6);
  gap_dist._M_h._M_buckets = &gap_dist._M_h._M_single_bucket;
  gap_dist._M_h._M_bucket_count = 1;
  gap_dist._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  gap_dist._M_h._M_element_count = 0;
  gap_dist._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  gap_dist._M_h._M_rehash_policy._M_next_resize = 0;
  gap_dist._M_h._M_single_bucket = (__node_base_ptr)0x0;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&seq,"",(allocator *)&iss);
  std::__cxx11::string::reserve((ulong)&seq);
  pSVar3 = local_510;
  this_00 = &local_510->oldnames_to_ids;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&this_00->_M_h);
  std::__cxx11::string::string((string *)&iss,"",(allocator *)&gfa_rtype);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pSVar3->oldnames,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss);
  std::__cxx11::string::~string((string *)&iss);
  std::vector<Node,_std::allocator<Node>_>::clear(&pSVar3->nodes);
  std::
  vector<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
  ::clear(&(pSVar3->super_DistanceGraph).links);
  std::__cxx11::string::string((string *)&iss,"",(allocator *)&gfa_rtype);
  Node::Node(&local_300,(string *)&iss,Deleted);
  local_508 = &this_00->_M_h;
  add_node(local_510,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&iss);
  local_4f8 = 0;
  do {
    while( true ) {
      if (((byte)fastaf[*(long *)(*(long *)fastaf + -0x18) + 0x20] & 2) != 0) {
        poVar6 = sdglib::OutputLog(INFO,true);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," nodes loaded (");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," canonised).");
        std::endl<char,std::char_traits<char>>(poVar6);
        gfa_rtype._M_dataplus._M_p = (pointer)&gfa_rtype.field_2;
        gfa_rtype._M_string_length = 0;
        uVar12 = 0;
        gfa_rtype.field_2._M_local_buf[0] = '\0';
        gfa_source._M_dataplus._M_p = (pointer)&gfa_source.field_2;
        gfa_source._M_string_length = 0;
        gfa_sourcedir._M_dataplus._M_p = (pointer)&gfa_sourcedir.field_2;
        gfa_sourcedir._M_string_length = 0;
        gfa_source.field_2._M_local_buf[0] = '\0';
        gfa_sourcedir.field_2._M_local_buf[0] = '\0';
        gfa_dest._M_dataplus._M_p = (pointer)&gfa_dest.field_2;
        gfa_dest._M_string_length = 0;
        gfa_destdir._M_dataplus._M_p = (pointer)&gfa_destdir.field_2;
        gfa_destdir._M_string_length = 0;
        gfa_dest.field_2._M_local_buf[0] = '\0';
        gfa_destdir.field_2._M_local_buf[0] = '\0';
        gfa_cigar._M_dataplus._M_p = (pointer)&gfa_cigar.field_2;
        gfa_cigar._M_string_length = 0;
        gfa_star._M_dataplus._M_p = (pointer)&gfa_star.field_2;
        gfa_star._M_string_length = 0;
        gfa_cigar.field_2._M_local_buf[0] = '\0';
        gfa_star.field_2._M_local_buf[0] = '\0';
        gfa_length._M_dataplus._M_p = (pointer)&gfa_length.field_2;
        gfa_length._M_string_length = 0;
        id._M_dataplus._M_p = (pointer)&id.field_2;
        id._M_string_length = 0;
        gfa_length.field_2._M_local_buf[0] = '\0';
        id.field_2._M_local_buf[0] = '\0';
        uVar13 = 0;
        while( true ) {
          piVar10 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)gfaf,(string *)&line);
          if ((((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) ||
             (((byte)gfaf[*(long *)(*(long *)gfaf + -0x18) + 0x20] & 2) != 0)) break;
          local_4f8 = uVar13;
          std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)&line,_S_in);
          std::operator>>((istream *)&iss,(string *)&gfa_rtype);
          bVar5 = std::operator==(&gfa_rtype,"S");
          if (bVar5) {
            std::operator>>((istream *)&iss,(string *)&gfa_source);
            std::operator>>((istream *)&iss,(string *)&gfa_length);
            std::operator>>((istream *)&iss,(string *)&gfa_star);
          }
          else {
            bVar5 = std::operator==(&gfa_rtype,"E");
            if (bVar5) {
              std::operator>>((istream *)&iss,(string *)&id);
              std::operator>>((istream *)&iss,(string *)&gfa_source);
              std::operator>>((istream *)&iss,(string *)&gfa_dest);
              std::istream::_M_extract<unsigned_int>((uint *)&iss);
              std::istream::_M_extract<unsigned_int>((uint *)&iss);
              std::istream::_M_extract<unsigned_int>((uint *)&iss);
              std::istream::_M_extract<unsigned_int>((uint *)&iss);
              std::operator>>((istream *)&iss,(string *)&gfa_cigar);
              dist = source_beg - source_end;
              std::__cxx11::string::operator=
                        ((string *)&gfa_sourcedir,
                         gfa_source._M_dataplus._M_p[gfa_source._M_string_length - 1]);
              std::__cxx11::string::pop_back();
              std::__cxx11::string::operator=
                        ((string *)&gfa_destdir,
                         gfa_dest._M_dataplus._M_p[gfa_dest._M_string_length - 1]);
              std::__cxx11::string::pop_back();
              p_Var4 = local_508;
              iVar7 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(local_508,&gfa_source);
              if (iVar7.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
                  ._M_cur == (__node_type *)0x0) {
                std::__cxx11::string::string((string *)&local_4a0,"",&local_511);
                Node::Node(&local_220,&local_4a0);
                sVar8 = add_node(local_510,&local_220);
                pmVar9 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)p_Var4,&gfa_source);
                *pmVar9 = sVar8;
                std::__cxx11::string::~string((string *)&local_220);
                std::__cxx11::string::~string((string *)&local_4a0);
              }
              iVar7 = std::
                      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      ::find(p_Var4,&gfa_dest);
              if (iVar7.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
                  ._M_cur == (__node_type *)0x0) {
                std::__cxx11::string::string((string *)&local_4a0,"",&local_511);
                Node::Node(&local_258,&local_4a0);
                sVar8 = add_node(local_510,&local_258);
                pmVar9 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)p_Var4,&gfa_dest);
                *pmVar9 = sVar8;
                std::__cxx11::string::~string((string *)&local_258);
                std::__cxx11::string::~string((string *)&local_4a0);
              }
              pmVar9 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)p_Var4,&gfa_source);
              lVar11 = *pmVar9;
              pmVar9 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)local_508,&gfa_dest);
              lVar2 = *pmVar9;
              bVar5 = std::operator==(&gfa_sourcedir,"+");
              lVar14 = -lVar11;
              if (!bVar5) {
                lVar14 = lVar11;
              }
              bVar5 = std::operator==(&gfa_destdir,"-");
              lVar11 = -lVar2;
              if (!bVar5) {
                lVar11 = lVar2;
              }
              DistanceGraph::add_link
                        (&local_510->super_DistanceGraph,lVar14,lVar11,dist,(Support)ZEXT816(0));
              uVar12 = uVar12 + 1;
            }
            else {
              bVar5 = std::operator==(&gfa_rtype,"G");
              if (bVar5) {
                std::operator>>((istream *)&iss,(string *)&id);
                std::operator>>((istream *)&iss,(string *)&gfa_source);
                std::operator>>((istream *)&iss,(string *)&gfa_dest);
                std::istream::operator>>((istream *)&iss,&dist);
                std::__cxx11::string::operator=
                          ((string *)&gfa_sourcedir,
                           gfa_source._M_dataplus._M_p[gfa_source._M_string_length - 1]);
                std::__cxx11::string::pop_back();
                std::__cxx11::string::operator=
                          ((string *)&gfa_destdir,
                           gfa_dest._M_dataplus._M_p[gfa_dest._M_string_length - 1]);
                std::__cxx11::string::pop_back();
                p_Var4 = local_508;
                iVar7 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(local_508,&gfa_source);
                if (iVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  std::__cxx11::string::string((string *)&local_4a0,"",&local_511);
                  Node::Node(&local_290,&local_4a0);
                  sVar8 = add_node(local_510,&local_290);
                  pmVar9 = std::__detail::
                           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)p_Var4,&gfa_source);
                  *pmVar9 = sVar8;
                  std::__cxx11::string::~string((string *)&local_290);
                  std::__cxx11::string::~string((string *)&local_4a0);
                }
                iVar7 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find(p_Var4,&gfa_dest);
                if (iVar7.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
                    ._M_cur == (__node_type *)0x0) {
                  std::__cxx11::string::string((string *)&local_4a0,"",&local_511);
                  Node::Node(&local_2c8,&local_4a0);
                  sVar8 = add_node(local_510,&local_2c8);
                  pmVar9 = std::__detail::
                           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                         *)p_Var4,&gfa_dest);
                  *pmVar9 = sVar8;
                  std::__cxx11::string::~string((string *)&local_2c8);
                  std::__cxx11::string::~string((string *)&local_4a0);
                }
                pmVar9 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)p_Var4,&gfa_source);
                lVar11 = *pmVar9;
                pmVar9 = std::__detail::
                         _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                       *)local_508,&gfa_dest);
                lVar2 = *pmVar9;
                bVar5 = std::operator==(&gfa_sourcedir,"+");
                lVar14 = -lVar11;
                if (!bVar5) {
                  lVar14 = lVar11;
                }
                bVar5 = std::operator==(&gfa_destdir,"-");
                lVar11 = -lVar2;
                if (!bVar5) {
                  lVar11 = lVar2;
                }
                DistanceGraph::add_link
                          (&local_510->super_DistanceGraph,lVar14,lVar11,dist,(Support)ZEXT816(0));
                local_4f8 = local_4f8 + 1;
              }
            }
          }
          std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
          uVar13 = local_4f8;
        }
        if ((float)uVar12 * 0.5 < (float)uVar13) {
          poVar6 = sdglib::OutputLog(WARN,true);
          poVar6 = std::operator<<(poVar6,"Warning: The loaded graph contains ");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6," non-overlapping links out of ");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::endl<char,std::char_traits<char>>(poVar6);
        }
        poVar6 = sdglib::OutputLog(INFO,true);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," nodes after connecting with ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," links.");
        std::endl<char,std::char_traits<char>>(poVar6);
        std::__cxx11::string::~string((string *)&id);
        std::__cxx11::string::~string((string *)&gfa_length);
        std::__cxx11::string::~string((string *)&gfa_star);
        std::__cxx11::string::~string((string *)&gfa_cigar);
        std::__cxx11::string::~string((string *)&gfa_destdir);
        std::__cxx11::string::~string((string *)&gfa_dest);
        std::__cxx11::string::~string((string *)&gfa_sourcedir);
        std::__cxx11::string::~string((string *)&gfa_source);
        std::__cxx11::string::~string((string *)&gfa_rtype);
        std::__cxx11::string::~string((string *)&seq);
        std::__cxx11::string::~string((string *)&name);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&gap_dist._M_h);
        std::__cxx11::string::~string((string *)&line);
        return;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)fastaf,(string *)&line);
      if ((((byte)fastaf[*(long *)(*(long *)fastaf + -0x18) + 0x20] & 2) != 0) ||
         (*line._M_dataplus._M_p == '>')) break;
      std::__cxx11::string::append((string *)&seq);
    }
    if (name._M_string_length != 0) {
      iVar7 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(local_508,&name);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_true>
          ._M_cur != (__node_type *)0x0) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&gfa_rtype,"sequence ",&name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&iss,
                       &gfa_rtype," is already defined");
        std::logic_error::logic_error(this_01,(string *)&iss);
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      Node::Node(&local_338,&seq);
      sVar8 = add_node(local_510,&local_338);
      pmVar9 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_508,&name);
      *pmVar9 = sVar8;
      std::__cxx11::string::~string((string *)&local_338);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pSVar3->oldnames,&name);
      bVar5 = Node::is_canonical((local_510->nodes).super__Vector_base<Node,_std::allocator<Node>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + -1);
      if (!bVar5) {
        Node::make_rc((local_510->nodes).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1);
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_508,&name);
        lVar11 = *pmVar9;
        pmVar9 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)local_508,&name);
        *pmVar9 = -lVar11;
        local_4f8 = local_4f8 + 1;
      }
    }
    name._M_string_length = 0;
    *name._M_dataplus._M_p = '\0';
    for (uVar13 = 1; (uVar13 < line._M_string_length && (line._M_dataplus._M_p[uVar13] != ' '));
        uVar13 = uVar13 + 1) {
      std::__cxx11::string::push_back((char)&name);
    }
    std::__cxx11::string::assign((char *)&seq);
  } while( true );
}

Assistant:

void SequenceDistanceGraph::load_from_gfa2(std::ifstream &gfaf, std::ifstream &fastaf) {
    std::string line;
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Graph fasta filename: " << fasta_filename << std::endl;
    //load all sequences from fasta file if they're not canonical, flip and remember they're flipped
    sdglib::OutputLog(sdglib::LogLevels::INFO) << "Loading sequences from " << fasta_filename << std::endl;

    std::unordered_map<std::string, unsigned int> gap_dist;
    std::string name, seq = "";
    seq.reserve(10000000); //stupid hack but probably useful to reserve
    oldnames_to_ids.clear();
    oldnames.push_back("");
    nodes.clear();
    links.clear();
    add_node(Node("",NodeStatus::Deleted)); //an empty deleted node on 0, just to skip the space
    sgNodeID_t nextid=1;
    uint64_t rcnodes=0;
    while(!fastaf.eof()){
        std::getline(fastaf,line);
        if (fastaf.eof() or line[0] == '>'){

            if (!name.empty()) {
                //rough ansi C and C++ mix but it works
                if (oldnames_to_ids.find(name) != oldnames_to_ids.end())
                    throw std::logic_error("sequence " + name + " is already defined");
                oldnames_to_ids[name] = add_node(Node(seq));
                oldnames.push_back(name);
                //reverse seq if not canonical
                if (!nodes.back().is_canonical()) {
                    nodes.back().make_rc();
                    oldnames_to_ids[name] = -oldnames_to_ids[name];
                    ++rcnodes;
                }
            }

            // Clear the name and set name to the new name, this is a new sequence!
            name.clear();
            for (auto i = 1; i < line.size() and line[i] != ' '; ++i) name += line[i];
            seq = "";
        } else {
            seq += line;

        }
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size()-1 << " nodes loaded (" << rcnodes << " canonised)." << std::endl;

    //load store all connections.

    std::string gfa_rtype,gfa_source,gfa_sourcedir,gfa_dest,gfa_destdir,gfa_cigar,gfa_star,gfa_length,id;
    unsigned int source_beg,source_end,dest_beg,dest_end;
    sgNodeID_t src_id,dest_id;
    int32_t dist;
    uint64_t lcount=0;
    uint64_t dist_egt0(0);
    while(std::getline(gfaf, line) and !gfaf.eof()) {
        std::istringstream iss(line);
        iss >> gfa_rtype;

        if (gfa_rtype == "S") {
            iss >> gfa_source;
            iss >> gfa_length;
            iss >> gfa_star;

            // The length of a sequence reported by GFA2 isn't required to match the actual length of the sequence
            /*
            if (oldnames_to_ids.find(gfa_source) != oldnames_to_ids.end()) {
                if (std::stoi(gfa_length.substr(5)) !=
                    nodes[std::abs(oldnames_to_ids[gfa_source])].sequence.length()) {
                    throw std::logic_error(
                            "Different length in node and fasta for sequence: " + gfa_source + " -> gfa:" +
                            gfa_length.substr(5) + ", fasta: " +
                            std::to_string(nodes[oldnames_to_ids[gfa_source]].sequence.length()));
                }
            }*/

        } else if (gfa_rtype == "E") {
            iss >> id;
            iss >> gfa_source;
            iss >> gfa_dest;
            iss >> source_beg;
            iss >> source_end;
            iss >> dest_beg;
            iss >> dest_end;
            iss >> gfa_cigar;

            dist =  -1 * (source_end - source_beg);
            gfa_sourcedir = gfa_source.back();
            gfa_source.pop_back();
            gfa_destdir = gfa_dest.back();
            gfa_dest.pop_back();

            //std::cout<<"'"<<source<<"' '"<<gfa_sourcedir<<"' '"<<dest<<"' '"<<destdir<<"'"<<std::endl;
            if (oldnames_to_ids.find(gfa_source) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_source] = add_node(Node(""));
                //std::cout<<"added source!" <<source<<std::endl;
            }
            if (oldnames_to_ids.find(gfa_dest) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_dest] = add_node(Node(""));
                //std::cout<<"added dest! "<<dest<<std::endl;
            }

            src_id=oldnames_to_ids[gfa_source];
            dest_id=oldnames_to_ids[gfa_dest];

            //Go from GFA's "Links as paths" to a normal "nodes have sinks (-/start/left) and sources (+/end/right)
            if (gfa_sourcedir == "+") src_id=-src_id;
            if (gfa_destdir == "-") dest_id=-dest_id;

            add_link(src_id,dest_id,dist);
            ++lcount;
        } else if (gfa_rtype == "G") {
            iss >> id;
            iss >> gfa_source;
            iss >> gfa_dest;
            iss >> dist;

            gfa_sourcedir = gfa_source.back();
            gfa_source.pop_back();
            gfa_destdir = gfa_dest.back();
            gfa_dest.pop_back();

            //std::cout<<"'"<<source<<"' '"<<gfa_sourcedir<<"' '"<<dest<<"' '"<<destdir<<"'"<<std::endl;
            if (oldnames_to_ids.find(gfa_source) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_source] = add_node(Node(""));
                //std::cout<<"added source!" <<source<<std::endl;
            }
            if (oldnames_to_ids.find(gfa_dest) == oldnames_to_ids.end()) {
                oldnames_to_ids[gfa_dest] = add_node(Node(""));
                //std::cout<<"added dest! "<<dest<<std::endl;
            }

            src_id=oldnames_to_ids[gfa_source];
            dest_id=oldnames_to_ids[gfa_dest];

            //Go from GFA's "Links as paths" to a normal "nodes have sinks (-/start/left) and sources (+/end/right)
            if (gfa_sourcedir == "+") src_id=-src_id;
            if (gfa_destdir == "-") dest_id=-dest_id;

            add_link(src_id,dest_id,dist);

            dist_egt0++;
        }
    }
    if (dist_egt0 > lcount*0.5f) {
        sdglib::OutputLog(sdglib::LogLevels::WARN) << "Warning: The loaded graph contains " << dist_egt0 << " non-overlapping links out of " << lcount << std::endl;
    }
    sdglib::OutputLog(sdglib::LogLevels::INFO) << nodes.size() - 1 << " nodes after connecting with " << lcount << " links." << std::endl;

}